

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O0

int __thiscall Player::attack(Player *this)

{
  Country *this_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  PlayerStrategy *pPVar4;
  ostream *poVar5;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *pvVar6;
  reference ppCVar7;
  GameLoop *this_01;
  vector<Player_*,_std::allocator<Player_*>_> *this_02;
  reference ppPVar8;
  Player **i;
  iterator __end2;
  iterator __begin2;
  vector<Player_*,_std::allocator<Player_*>_> *__range2;
  Player *defendingPlayer;
  Country *toCountry;
  Country *local_68;
  Country *fromCountry;
  int failsafeCounter;
  string local_50;
  int local_2c;
  int local_28;
  int numDefendingDice;
  int numAttackingDice;
  int toCountryIndex;
  int fromCountryIndex;
  char playerChoice;
  Player *this_local;
  
  toCountryIndex._3_1_ = '\0';
  _fromCountryIndex = this;
  setPlayerState(this,ATTACKING);
  notifyAll(this);
  pPVar4 = getStrategy(this);
  PlayerStrategy::getStrategyName_abi_cxx11_(&local_50,pPVar4);
  bVar1 = std::operator==(&local_50,"CHEATER");
  std::__cxx11::string::~string((string *)&local_50);
  if (bVar1) {
    pPVar4 = getStrategy(this);
    iVar2 = (**pPVar4->_vptr_PlayerStrategy)(pPVar4,0);
    this_local._4_4_ = (int)(char)iVar2;
  }
  else {
    fromCountry._0_4_ = 0;
    while ((int)fromCountry < 10) {
      fromCountry._0_4_ = (int)fromCountry + 1;
      std::ios::clear((long)&std::cin + *(long *)(std::cin + -0x18),0);
      poVar5 = std::operator<<((ostream *)&std::cout,"It is Player ");
      iVar2 = getPlayerId(this);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
      poVar5 = std::operator<<(poVar5,"\'s turn to attack!");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      std::operator<<((ostream *)&std::cout,"\n[ATTACKER] Will you attack?(y/n)");
      iVar2 = (**this->strategy->_vptr_PlayerStrategy)(this->strategy,0);
      toCountryIndex._3_1_ = (char)iVar2;
      if ((toCountryIndex._3_1_ == 'y') || (toCountryIndex._3_1_ == 'n')) {
        if (toCountryIndex._3_1_ != 'y') {
          poVar5 = std::operator<<((ostream *)&std::cout,"\nPlayer ");
          iVar2 = getPlayerId(this);
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
          poVar5 = std::operator<<(poVar5," has chosen NOT to attack!");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          setPlayerState(this,IDLE);
          (*this->strategy->_vptr_PlayerStrategy[5])();
          return 0;
        }
        poVar5 = std::operator<<((ostream *)&std::cout,"\nPlayer ");
        iVar2 = getPlayerId(this);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
        poVar5 = std::operator<<(poVar5," has chosen to attack!");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        numAttackingDice = getAttackingCountry(this);
        pvVar6 = getOwnedCountries(this);
        ppCVar7 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::at
                            (pvVar6,(long)numAttackingDice);
        local_68 = *ppCVar7;
        iVar2 = Map::Country::getNumberOfTroops(local_68);
        if (iVar2 < 2) {
          poVar5 = std::operator<<((ostream *)&std::cout,"Country ");
          Map::Country::getCountryName_abi_cxx11_((string *)&toCountry,local_68);
          poVar5 = std::operator<<(poVar5,(string *)&toCountry);
          std::operator<<(poVar5,
                          " does not have enough armies to attack. Choose a different country. Proceeding...\n"
                         );
          std::__cxx11::string::~string((string *)&toCountry);
        }
        else {
          numDefendingDice = getDefendingCountry(local_68,this);
          pvVar6 = Map::Country::getAdjCountries(local_68);
          ppCVar7 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::at
                              (pvVar6,(long)numDefendingDice);
          this_00 = *ppCVar7;
          iVar2 = Map::Country::getPlayerOwnerID(local_68);
          iVar3 = Map::Country::getPlayerOwnerID(this_00);
          if (iVar2 == iVar3) {
            std::operator<<((ostream *)&std::cout,
                            "\n[ATTACKER] You cannot attack your own country! Proceeding...\n\n");
          }
          else {
            local_28 = getNumAttackingDice(this,local_68);
            local_2c = getNumDefendingDice(this_00,this);
            __range2 = (vector<Player_*,_std::allocator<Player_*>_> *)0x0;
            this_01 = GameLoop::getInstance();
            this_02 = GameLoop::getAllPlayers(this_01);
            __end2 = std::vector<Player_*,_std::allocator<Player_*>_>::begin(this_02);
            i = (Player **)std::vector<Player_*,_std::allocator<Player_*>_>::end(this_02);
            while (bVar1 = __gnu_cxx::operator!=
                                     (&__end2,(__normal_iterator<Player_**,_std::vector<Player_*,_std::allocator<Player_*>_>_>
                                               *)&i), bVar1) {
              ppPVar8 = __gnu_cxx::
                        __normal_iterator<Player_**,_std::vector<Player_*,_std::allocator<Player_*>_>_>
                        ::operator*(&__end2);
              iVar2 = getPlayerId(*ppPVar8);
              iVar3 = Map::Country::getPlayerOwnerID(this_00);
              if (iVar2 == iVar3) {
                __range2 = (vector<Player_*,_std::allocator<Player_*>_> *)*ppPVar8;
                break;
              }
              __gnu_cxx::
              __normal_iterator<Player_**,_std::vector<Player_*,_std::allocator<Player_*>_>_>::
              operator++(&__end2);
            }
            if (__range2 == (vector<Player_*,_std::allocator<Player_*>_> *)0x0) {
              setPlayerState(this,IDLE);
              (*this->strategy->_vptr_PlayerStrategy[5])();
              return -1;
            }
            iVar2 = executeAttack(this,local_68,this_00,(Player *)__range2,local_28,local_2c);
            if (iVar2 == 1) {
              poVar5 = std::operator<<((ostream *)&std::cout,"\n[ATTACK SUCCEEDED] - Proceeding.");
              std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
            }
            else {
              poVar5 = std::operator<<((ostream *)&std::cout,
                                       "\n[ATTACK FAILED] - Make sure that you chose appropriate values."
                                      );
              std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
            }
          }
        }
      }
      else {
        std::operator<<((ostream *)&std::cout,"\nInvalid Input. Please try again.\n");
      }
    }
    std::operator<<((ostream *)&std::cout,
                    "\nInvalid user input for 10 consecutive prompts, aborting action.\n");
    setPlayerState(this,IDLE);
    (*this->strategy->_vptr_PlayerStrategy[5])();
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int Player::attack() {

    char playerChoice = 0;
    int fromCountryIndex;
    int toCountryIndex;
    int numAttackingDice;
    int numDefendingDice;

    this->setPlayerState(PlayerState::ATTACKING);
    this->notifyAll();

    if ( this->getStrategy()->getStrategyName() == "CHEATER") {
        return (PlayerAction) this->getStrategy()->yesOrNo(StrategyContext::ATTACK);
    }

    /* USER DECISION TO ATTACK OR NOT*/
    int failsafeCounter = 0;
    do {
        //avoid infinite loops in case of bot malfunction or human delaying the game
        if(failsafeCounter >= 10){
            std::cout << "\nInvalid user input for 10 consecutive prompts, aborting action.\n";
            this->setPlayerState(PlayerState::IDLE);
            this->strategy->resetChoices();
            return PlayerAction::ABORTED;
        }
        failsafeCounter++;

        std::cin.clear();
        std::cout << "It is Player " << this->getPlayerId() << "'s turn to attack!" << std::endl;
        std::cout << "\n[ATTACKER] Will you attack?(y/n)";
        playerChoice = strategy->yesOrNo(StrategyContext::ATTACK);
        if (playerChoice != 'y' && playerChoice != 'n') {
            std::cout << "\nInvalid Input. Please try again.\n";
            continue;
        }

        if (playerChoice == 'y') {
            std::cout << "\nPlayer " << this->getPlayerId() << " has chosen to attack!" << std::endl;
            /*USER CHOOSES FROM WHICH COUNTRY TO ATTACK*/
            fromCountryIndex = getAttackingCountry(this);
        } else {
            std::cout << "\nPlayer " << this->getPlayerId() << " has chosen NOT to attack!" << std::endl;
            this->setPlayerState(PlayerState::IDLE);
            this->strategy->resetChoices();
            return PlayerAction::ABORTED;
        }

        // Get the country to attack from
        Map::Country *fromCountry = this->getOwnedCountries()->at(fromCountryIndex);
        if (fromCountry->getNumberOfTroops() < 2) {
            std::cout << "Country " << fromCountry->getCountryName()
                      << " does not have enough armies to attack. Choose a different country. Proceeding...\n";
            continue;
        }

        /* USER CHOOSES WHICH COUNTRY TO ATTACK*/
        toCountryIndex = getDefendingCountry(fromCountry, this);

        Map::Country *toCountry = fromCountry->getAdjCountries()->at(toCountryIndex);
        if (fromCountry->getPlayerOwnerID() == toCountry->getPlayerOwnerID()) {
            std::cout << "\n[ATTACKER] You cannot attack your own country! Proceeding...\n\n";
            continue;
        }

        /*ATTACKER CHOOSES HOW MANY DICE TO ROLL*/
        numAttackingDice = getNumAttackingDice(this, fromCountry);

        /*DEFENDER CHOOSES HOW MANY DICE TO ROLL*/
        numDefendingDice = getNumDefendingDice(toCountry, this);

        /* GET THE DEFENDING PLAYER */
        Player *defendingPlayer = nullptr;
        for (auto &i : *GameLoop::getInstance()->getAllPlayers()) {
            if (i->getPlayerId() == toCountry->getPlayerOwnerID()) {
                defendingPlayer = i;
                break;
            }
        }
        if (defendingPlayer == nullptr) {
            this->setPlayerState(PlayerState::IDLE);
            this->strategy->resetChoices();
            return PlayerAction::FAILED;
        }

        if (this->executeAttack(fromCountry, toCountry, defendingPlayer, numAttackingDice, numDefendingDice) == PlayerAction::SUCCEEDED) {
            std::cout << "\n[ATTACK SUCCEEDED] - Proceeding." << std::endl;
            continue;
        } else {
            std::cout << "\n[ATTACK FAILED] - Make sure that you chose appropriate values." << std::endl;
            continue;
        }
    } while (true);
}